

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

type fmt::v5::
     visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
               (width_checker<fmt::v5::internal::error_handler> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               *arg)

{
  type tVar1;
  
  switch(arg->type_) {
  case int_type:
    tVar1 = (type)(arg->value_).field_0.int_value;
    break;
  case uint_type:
    return (ulong)(arg->value_).field_0.uint_value;
  case long_long_type:
    tVar1 = (arg->value_).field_0.long_long_value;
    break;
  case ulong_long_type:
    return (arg->value_).field_0.long_long_value;
  default:
    internal::error_handler::on_error((error_handler *)vis,"width is not integer");
  }
  if (-1 < (long)tVar1) {
    return tVar1;
  }
  internal::error_handler::on_error((error_handler *)vis,"negative width");
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}